

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

void __thiscall
RootIndexProxyModelPrivate::onRowsAboutToBeMoved
          (RootIndexProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,int sourceEnd,
          QModelIndex *destParent,int dest)

{
  QModelIndex childIdx;
  QModelIndex childIdx_00;
  RootIndexProxyModel *pRVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  undefined1 local_d0 [24];
  undefined1 local_b8 [24];
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  QPersistentModelIndex local_70;
  undefined8 local_68;
  QAbstractItemModel *local_60;
  QPersistentModelIndex local_58;
  undefined8 local_50;
  QAbstractItemModel *local_48;
  byte local_39;
  RootIndexProxyModel *pRStack_38;
  bool isDescendantRootDestParent;
  RootIndexProxyModel *q;
  QModelIndex *pQStack_28;
  int dest_local;
  QModelIndex *destParent_local;
  int sourceEnd_local;
  int sourceStart_local;
  QModelIndex *sourceParent_local;
  RootIndexProxyModelPrivate *this_local;
  
  q._4_4_ = dest;
  pQStack_28 = destParent;
  destParent_local._0_4_ = sourceEnd;
  destParent_local._4_4_ = sourceStart;
  _sourceEnd_local = sourceParent;
  sourceParent_local = (QModelIndex *)this;
  pRStack_38 = q_func(this);
  bVar4 = ignoreMove(this,_sourceEnd_local,pQStack_28);
  if (!bVar4) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58);
    childIdx.i = local_50;
    childIdx._0_8_ = local_58.d;
    childIdx.m = local_48;
    bVar4 = isDescendant(this,childIdx,pQStack_28);
    local_39 = bVar4;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70);
    childIdx_00.i = local_68;
    childIdx_00._0_8_ = local_70.d;
    childIdx_00.m = local_60;
    bVar5 = isDescendant(this,childIdx_00,_sourceEnd_local);
    pRVar1 = pRStack_38;
    if (bVar4 == bVar5) {
      if ((local_39 & 1) == 0) {
        (**(code **)(*(long *)pRStack_38 + 0x198))(local_88,pRStack_38,_sourceEnd_local);
        iVar3 = destParent_local._4_4_;
        uVar2 = (uint)destParent_local;
        (**(code **)(*(long *)pRStack_38 + 0x198))(local_a0,pRStack_38,pQStack_28);
        QAbstractItemModel::beginMoveRows
                  ((QModelIndex *)pRVar1,(int)local_88,iVar3,(QModelIndex *)(ulong)uVar2,
                   (int)local_a0);
      }
    }
    else if ((local_39 & 1) == 0) {
      (**(code **)(*(long *)pRStack_38 + 0x198))(local_d0,pRStack_38,pQStack_28);
      QAbstractItemModel::beginInsertRows((QModelIndex *)pRVar1,(int)local_d0,q._4_4_);
    }
    else {
      (**(code **)(*(long *)pRStack_38 + 0x198))(local_b8,pRStack_38,_sourceEnd_local);
      QAbstractItemModel::beginRemoveRows
                ((QModelIndex *)pRVar1,(int)local_b8,destParent_local._4_4_);
    }
  }
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onRowsAboutToBeMoved(const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destParent,
                                                      int dest)
{
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == q->sourceModel());
    Q_ASSERT(!destParent.isValid() || destParent.model() == q->sourceModel());
    if (ignoreMove(sourceParent, destParent))
        return;
    const bool isDescendantRootDestParent = isDescendant(m_rootIndex, destParent);
    if (isDescendantRootDestParent == isDescendant(m_rootIndex, sourceParent)) {
        if (isDescendantRootDestParent)
            return;
        q->beginMoveRows(q->mapFromSource(sourceParent), sourceStart, sourceEnd, q->mapFromSource(destParent), dest);
    } else if (isDescendantRootDestParent) {

        q->beginRemoveRows(q->mapFromSource(sourceParent), sourceStart, sourceEnd);
    } else {
        q->beginInsertRows(q->mapFromSource(destParent), dest, dest + sourceEnd - sourceStart);
    }
}